

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_radio_interface.c
# Opt level: O2

dlep_radio_if * dlep_radio_add_interface(char *ifname)

{
  int iVar1;
  dlep_radio_if *pdVar2;
  
  pdVar2 = dlep_radio_get_by_layer2_if(ifname);
  if (pdVar2 == (dlep_radio_if *)0x0) {
    pdVar2 = (dlep_radio_if *)oonf_class_malloc(&_interface_class);
    if (pdVar2 != (dlep_radio_if *)0x0) {
      iVar1 = dlep_if_add((dlep_if *)pdVar2,ifname,&_l2_origin,&_l2_default_origin,
                          (_func_int_os_interface_listener_ptr *)0x0,LOG_DLEP_RADIO,true);
      if (iVar1 == 0) {
        (pdVar2->tcp).config.session_timeout = 120000;
        (pdVar2->tcp).config.maximum_input_buffer = 0x1000;
        (pdVar2->tcp).config.allowed_sessions = 3;
        dlep_radio_session_initialize_tcp_callbacks(&(pdVar2->tcp).config);
        oonf_stream_add_managed(&pdVar2->tcp);
        return pdVar2;
      }
      oonf_class_free(&_interface_class,pdVar2);
    }
    pdVar2 = (dlep_radio_if *)0x0;
  }
  return pdVar2;
}

Assistant:

struct dlep_radio_if *
dlep_radio_add_interface(const char *ifname) {
  struct dlep_radio_if *interface;

  interface = dlep_radio_get_by_layer2_if(ifname);
  if (interface) {
    return interface;
  }

  interface = oonf_class_malloc(&_interface_class);
  if (!interface) {
    return NULL;
  }

  if (dlep_if_add(&interface->interf, ifname, &_l2_origin, &_l2_default_origin, NULL, LOG_DLEP_RADIO, true)) {
    oonf_class_free(&_interface_class, interface);
    return NULL;
  }

  /* configure TCP server socket */
  interface->tcp.config.session_timeout = 120000; /* 120 seconds */
  interface->tcp.config.maximum_input_buffer = 4096;
  interface->tcp.config.allowed_sessions = 3;
  dlep_radio_session_initialize_tcp_callbacks(&interface->tcp.config);

  oonf_stream_add_managed(&interface->tcp);

  return interface;
}